

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_rescaleFreqs(optState_t *optPtr,BYTE *src,size_t srcSize,int optLevel)

{
  short sVar1;
  ZSTD_paramSwitch_e ZVar2;
  ZSTD_entropyCTables_t *pZVar3;
  U32 UVar4;
  undefined8 in_RAX;
  long lVar5;
  uint *puVar6;
  long lVar7;
  uint *puVar8;
  uint uVar9;
  byte bVar10;
  undefined1 auVar11 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar12 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  uint uVar15;
  uint uVar16;
  undefined1 in_XMM5 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint lit;
  undefined8 uStack_18;
  
  bVar10 = 0;
  ZVar2 = optPtr->literalCompressionMode;
  optPtr->priceType = zop_dynamic;
  uStack_18 = in_RAX;
  if (optPtr->litLengthSum == 0) {
    if (srcSize < 9) {
      optPtr->priceType = zop_predef;
    }
    pZVar3 = optPtr->symbolCosts;
    if (pZVar3 == (ZSTD_entropyCTables_t *)0x0) {
      __assert_fail("optPtr->symbolCosts != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7fbe,
                    "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                   );
    }
    if ((pZVar3->huf).repeatMode == HUF_repeat_valid) {
      optPtr->priceType = zop_dynamic;
      if (ZVar2 != ZSTD_ps_disable) {
        puVar6 = optPtr->litFreq;
        if (puVar6 == (uint *)0x0) {
          __assert_fail("optPtr->litFreq != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7fc7,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        optPtr->litSum = 0;
        lVar5 = 0;
        do {
          bVar10 = (byte)(pZVar3->huf).CTable[lVar5 + 1];
          if (0xb < bVar10) {
            __assert_fail("bitCost <= scaleLog",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x7fcc,
                          "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                         );
          }
          uVar9 = 1 << (0xb - bVar10 & 0x1f);
          if (bVar10 == 0) {
            uVar9 = 1;
          }
          puVar6[lVar5] = uVar9;
          optPtr->litSum = optPtr->litSum + uVar9;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x100);
      }
      sVar1 = (short)(pZVar3->fse).litlengthCTable[0];
      lVar5 = 1;
      if (sVar1 != 0) {
        lVar5 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->litLengthSum = 0;
      lVar7 = 0;
      do {
        uVar9 = (pZVar3->fse).litlengthCTable[lVar5 + lVar7 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar9) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7fd8,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar14 = 1 << (10U - (char)(uVar9 >> 0x10) & 0x1f);
        if (uVar9 < 0x10000) {
          uVar14 = 1;
        }
        optPtr->litLengthFreq[lVar7] = uVar14;
        optPtr->litLengthSum = optPtr->litLengthSum + uVar14;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x24);
      sVar1 = (short)(pZVar3->fse).matchlengthCTable[0];
      lVar5 = 1;
      if (sVar1 != 0) {
        lVar5 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->matchLengthSum = 0;
      lVar7 = 0;
      do {
        uVar9 = (pZVar3->fse).matchlengthCTable[lVar5 + lVar7 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar9) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7fe4,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar14 = 1 << (10U - (char)(uVar9 >> 0x10) & 0x1f);
        if (uVar9 < 0x10000) {
          uVar14 = 1;
        }
        optPtr->matchLengthFreq[lVar7] = uVar14;
        optPtr->matchLengthSum = optPtr->matchLengthSum + uVar14;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x35);
      sVar1 = (short)(pZVar3->fse).offcodeCTable[0];
      lVar5 = 1;
      if (sVar1 != 0) {
        lVar5 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->offCodeSum = 0;
      lVar7 = 0;
      do {
        uVar9 = (pZVar3->fse).offcodeCTable[lVar5 + lVar7 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar9) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7ff0,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar14 = 1 << (10U - (char)(uVar9 >> 0x10) & 0x1f);
        if (uVar9 < 0x10000) {
          uVar14 = 1;
        }
        optPtr->offCodeFreq[lVar7] = uVar14;
        optPtr->offCodeSum = optPtr->offCodeSum + uVar14;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      goto LAB_001cf439;
    }
    if (optPtr->litFreq == (uint *)0x0) {
      __assert_fail("optPtr->litFreq != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7ff7,
                    "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                   );
    }
    if (ZVar2 != ZSTD_ps_disable) {
      uStack_18 = CONCAT44(0xff,(int)in_RAX);
      HIST_count_simple(optPtr->litFreq,(uint *)((long)&uStack_18 + 4),src,srcSize);
      puVar6 = optPtr->litFreq;
      in_XMM1 = (undefined1  [16])0x0;
      lVar5 = 0;
      auVar11 = (undefined1  [16])0x0;
      do {
        puVar8 = puVar6 + lVar5;
        uVar9 = ((*puVar8 >> 8) - (uint)(*puVar8 == 0)) + 1;
        uVar14 = ((puVar8[1] >> 8) - (uint)(puVar8[1] == 0)) + 1;
        uVar15 = ((puVar8[2] >> 8) - (uint)(puVar8[2] == 0)) + 1;
        uVar16 = ((puVar8[3] >> 8) - (uint)(puVar8[3] == 0)) + 1;
        auVar17._0_4_ = auVar11._0_4_ + uVar9;
        auVar17._4_4_ = auVar11._4_4_ + uVar14;
        auVar17._8_4_ = auVar11._8_4_ + uVar15;
        auVar17._12_4_ = auVar11._12_4_ + uVar16;
        puVar8 = puVar6 + lVar5;
        *puVar8 = uVar9;
        puVar8[1] = uVar14;
        puVar8[2] = uVar15;
        puVar8[3] = uVar16;
        lVar5 = lVar5 + 4;
        auVar11 = auVar17;
      } while (lVar5 != 0x100);
      auVar11 = phaddd(auVar17,auVar17);
      auVar11 = phaddd(auVar11,auVar11);
      optPtr->litSum = auVar11._0_4_;
    }
    memcpy(optPtr->litLengthFreq,&DAT_00302da0,0x90);
    optPtr->litLengthSum = 0x28;
    auVar11 = _DAT_0027d800;
    puVar6 = optPtr->matchLengthFreq;
    auVar12 = pmovsxbq(extraout_XMM0,0x302);
    auVar13 = pmovsxbq(in_XMM1,0x100);
    lVar5 = 3;
    auVar17 = pmovsxbq(in_XMM5,0x404);
    do {
      auVar18 = auVar13 ^ auVar11;
      if (auVar18._4_4_ == -0x80000000 && auVar18._0_4_ < -0x7fffffcb) {
        puVar6[lVar5 + -3] = 1;
        puVar6[lVar5 + -2] = 1;
      }
      auVar18 = auVar12 ^ auVar11;
      if (auVar18._4_4_ == -0x80000000 && auVar18._0_4_ < -0x7fffffcb) {
        puVar6[lVar5 + -1] = 1;
        puVar6[lVar5] = 1;
      }
      lVar7 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + auVar17._0_8_;
      auVar13._8_8_ = lVar7 + auVar17._8_8_;
      lVar7 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + auVar17._0_8_;
      auVar12._8_8_ = lVar7 + auVar17._8_8_;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x3b);
    optPtr->matchLengthSum = 0x35;
    puVar6 = &DAT_00302e30;
    puVar8 = optPtr->offCodeFreq;
    for (lVar5 = 0x20; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar8 = *puVar6;
      puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
    }
    UVar4 = 0x35;
  }
  else {
    if (ZVar2 != ZSTD_ps_disable) {
      UVar4 = ZSTD_scaleStats(optPtr->litFreq,0xff,0xc);
      optPtr->litSum = UVar4;
    }
    UVar4 = ZSTD_scaleStats(optPtr->litLengthFreq,0x23,0xb);
    optPtr->litLengthSum = UVar4;
    UVar4 = ZSTD_scaleStats(optPtr->matchLengthFreq,0x34,0xb);
    optPtr->matchLengthSum = UVar4;
    UVar4 = ZSTD_scaleStats(optPtr->offCodeFreq,0x1f,0xb);
  }
  optPtr->offCodeSum = UVar4;
LAB_001cf439:
  ZSTD_setBasePrices(optPtr,optLevel);
  return;
}

Assistant:

static void
ZSTD_rescaleFreqs(optState_t* const optPtr,
            const BYTE* const src, size_t const srcSize,
                  int const optLevel)
{
    int const compressedLiterals = ZSTD_compressedLiterals(optPtr);
    DEBUGLOG(5, "ZSTD_rescaleFreqs (srcSize=%u)", (unsigned)srcSize);
    optPtr->priceType = zop_dynamic;

    if (optPtr->litLengthSum == 0) {  /* no literals stats collected -> first block assumed -> init */

        /* heuristic: use pre-defined stats for too small inputs */
        if (srcSize <= ZSTD_PREDEF_THRESHOLD) {
            DEBUGLOG(5, "srcSize <= %i : use predefined stats", ZSTD_PREDEF_THRESHOLD);
            optPtr->priceType = zop_predef;
        }

        assert(optPtr->symbolCosts != NULL);
        if (optPtr->symbolCosts->huf.repeatMode == HUF_repeat_valid) {

            /* huffman stats covering the full value set : table presumed generated by dictionary */
            optPtr->priceType = zop_dynamic;

            if (compressedLiterals) {
                /* generate literals statistics from huffman table */
                unsigned lit;
                assert(optPtr->litFreq != NULL);
                optPtr->litSum = 0;
                for (lit=0; lit<=MaxLit; lit++) {
                    U32 const scaleLog = 11;   /* scale to 2K */
                    U32 const bitCost = HUF_getNbBitsFromCTable(optPtr->symbolCosts->huf.CTable, lit);
                    assert(bitCost <= scaleLog);
                    optPtr->litFreq[lit] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litSum += optPtr->litFreq[lit];
            }   }

            {   unsigned ll;
                FSE_CState_t llstate;
                FSE_initCState(&llstate, optPtr->symbolCosts->fse.litlengthCTable);
                optPtr->litLengthSum = 0;
                for (ll=0; ll<=MaxLL; ll++) {
                    U32 const scaleLog = 10;   /* scale to 1K */
                    U32 const bitCost = FSE_getMaxNbBits(llstate.symbolTT, ll);
                    assert(bitCost < scaleLog);
                    optPtr->litLengthFreq[ll] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litLengthSum += optPtr->litLengthFreq[ll];
            }   }

            {   unsigned ml;
                FSE_CState_t mlstate;
                FSE_initCState(&mlstate, optPtr->symbolCosts->fse.matchlengthCTable);
                optPtr->matchLengthSum = 0;
                for (ml=0; ml<=MaxML; ml++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(mlstate.symbolTT, ml);
                    assert(bitCost < scaleLog);
                    optPtr->matchLengthFreq[ml] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->matchLengthSum += optPtr->matchLengthFreq[ml];
            }   }

            {   unsigned of;
                FSE_CState_t ofstate;
                FSE_initCState(&ofstate, optPtr->symbolCosts->fse.offcodeCTable);
                optPtr->offCodeSum = 0;
                for (of=0; of<=MaxOff; of++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(ofstate.symbolTT, of);
                    assert(bitCost < scaleLog);
                    optPtr->offCodeFreq[of] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->offCodeSum += optPtr->offCodeFreq[of];
            }   }

        } else {  /* first block, no dictionary */

            assert(optPtr->litFreq != NULL);
            if (compressedLiterals) {
                /* base initial cost of literals on direct frequency within src */
                unsigned lit = MaxLit;
                HIST_count_simple(optPtr->litFreq, &lit, src, srcSize);   /* use raw first block to init statistics */
                optPtr->litSum = ZSTD_downscaleStats(optPtr->litFreq, MaxLit, 8, base_0possible);
            }

            {   unsigned const baseLLfreqs[MaxLL+1] = {
                    4, 2, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1
                };
                ZSTD_memcpy(optPtr->litLengthFreq, baseLLfreqs, sizeof(baseLLfreqs));
                optPtr->litLengthSum = sum_u32(baseLLfreqs, MaxLL+1);
            }

            {   unsigned ml;
                for (ml=0; ml<=MaxML; ml++)
                    optPtr->matchLengthFreq[ml] = 1;
            }
            optPtr->matchLengthSum = MaxML+1;

            {   unsigned const baseOFCfreqs[MaxOff+1] = {
                    6, 2, 1, 1, 2, 3, 4, 4,
                    4, 3, 2, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1
                };
                ZSTD_memcpy(optPtr->offCodeFreq, baseOFCfreqs, sizeof(baseOFCfreqs));
                optPtr->offCodeSum = sum_u32(baseOFCfreqs, MaxOff+1);
            }

        }

    } else {   /* new block : scale down accumulated statistics */

        if (compressedLiterals)
            optPtr->litSum = ZSTD_scaleStats(optPtr->litFreq, MaxLit, 12);
        optPtr->litLengthSum = ZSTD_scaleStats(optPtr->litLengthFreq, MaxLL, 11);
        optPtr->matchLengthSum = ZSTD_scaleStats(optPtr->matchLengthFreq, MaxML, 11);
        optPtr->offCodeSum = ZSTD_scaleStats(optPtr->offCodeFreq, MaxOff, 11);
    }

    ZSTD_setBasePrices(optPtr, optLevel);
}